

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

bool __thiscall
crnlib::dxt1_endpoint_optimizer::potential_solution::are_selectors_all_equal
          (potential_solution *this)

{
  uchar *puVar1;
  uchar *puVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = (ulong)(this->m_selectors).m_size;
  if (uVar3 == 0) {
    return false;
  }
  puVar2 = (this->m_selectors).m_p;
  uVar4 = 1;
  do {
    bVar5 = uVar3 == uVar4;
    if (bVar5) {
      return bVar5;
    }
    puVar1 = puVar2 + uVar4;
    uVar4 = uVar4 + 1;
  } while (*puVar1 == *puVar2);
  return bVar5;
}

Assistant:

inline bool empty() const { return !m_size; }